

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void IO_ENTRYINFO(EventEnum entryid)

{
  char *pcVar1;
  void *from;
  uint32 x;
  int iVar2;
  HashMap_stackframe *pHVar3;
  undefined8 *__ptr;
  char *pcVar4;
  char *pcVar5;
  pthread_t x_00;
  uint uVar6;
  uint x_01;
  ulong uVar7;
  ulong uVar8;
  void *callstack [34];
  void *new_strings_ptrs [32];
  char *new_strings [32];
  void *local_350;
  undefined1 local_348 [16];
  uint64 auStack_338 [32];
  uint64 auStack_238 [32];
  undefined8 auStack_138 [33];
  
  x = now();
  iVar2 = backtrace(local_348);
  uVar8 = 0;
  if (2 < iVar2) {
    uVar6 = iVar2 - 2;
    uVar8 = 0;
    x_01 = 0;
    do {
      from = (void *)auStack_338[uVar8];
      local_350 = from;
      pHVar3 = get_hashitem_stackframe(from,(uint8 *)0x0);
      if ((pHVar3 == (HashMap_stackframe *)0x0) || (pHVar3->to == (char *)0x0)) {
        __ptr = (undefined8 *)backtrace_symbols(&local_350,1);
        pcVar5 = (char *)*__ptr;
        if (pcVar5 == (char *)0x0) {
          free(__ptr);
        }
        else {
          pcVar4 = pcVar5;
          if (*pcVar5 == '0') {
            do {
              pcVar5 = pcVar4 + 1;
              pcVar1 = pcVar4 + 1;
              pcVar4 = pcVar5;
            } while (*pcVar1 == ' ');
          }
          pcVar5 = strdup(pcVar5);
          free(__ptr);
          if (pcVar5 != (char *)0x0) {
            add_stackframe_to_map(local_350,pcVar5);
            auStack_138[(int)x_01] = pcVar5;
            auStack_238[(int)x_01] = (uint64)from;
            x_01 = x_01 + 1;
            goto LAB_00104050;
          }
        }
        uVar6 = (uint)uVar8;
        break;
      }
LAB_00104050:
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
    if (0 < (int)x_01) {
      writele32(3);
      writele32(x_01);
      uVar8 = 0;
      do {
        IO_UINT64(auStack_238[uVar8]);
        IO_STRING((char *)auStack_138[uVar8]);
        uVar8 = uVar8 + 1;
      } while (x_01 != uVar8);
    }
    uVar8 = (ulong)uVar6;
  }
  writele32(entryid);
  writele32(x);
  x_00 = pthread_self();
  IO_UINT64(x_00);
  writele32((uint32)uVar8);
  if ((uint32)uVar8 != 0) {
    uVar7 = 0;
    do {
      IO_UINT64(auStack_338[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  return;
}

Assistant:

__attribute__((noinline)) static void IO_ENTRYINFO(const EventEnum entryid)
{
    const uint32 currentms = now();
    void* callstack[MAX_CALLSTACKS + 2];
    char *new_strings[MAX_CALLSTACKS];
    void *new_strings_ptrs[MAX_CALLSTACKS];
    int frames = backtrace(callstack, MAX_CALLSTACKS);
    int num_new_strings = 0;
    int i;

    frames -= 2;  // skip IO_ENTRYINFO and entry point.
    if (frames < 0) {
        frames = 0;
    }

    for (i = 0; i < frames; i++) {
        int seen_before = 0;
        void *ptr = callstack[i + 2];
        char *str = get_callstack_sym(ptr, &seen_before);
        if ((str == NULL) && !seen_before) {
            break;
        }

        if (!seen_before) {
            new_strings[num_new_strings] = str;
            new_strings_ptrs[num_new_strings] = ptr;
            num_new_strings++;
        }
    }
    frames = i;  /* in case we stopped early. */

    if (num_new_strings > 0) {
        IO_EVENTENUM(ALEE_NEW_CALLSTACK_SYMS);
        IO_UINT32((uint32) num_new_strings);
        for (i = 0; i < num_new_strings; i++) {
            IO_PTR(new_strings_ptrs[i]);
            IO_STRING(new_strings[i]);
        }
    }

    IO_EVENTENUM(entryid);
    IO_UINT32(currentms);
    IO_UINT64((uint64) pthread_self());

    IO_UINT32((uint32) frames);
    for (i = 0; i < frames; i++) {
        IO_PTR(callstack[i + 2]);
    }
}